

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O0

void __thiscall deqp::gls::TextureBufferCase::deinit(TextureBufferCase *this)

{
  ShaderProgram *pSVar1;
  TextureBufferCase *this_local;
  
  if (this->m_preRenderProgram == this->m_postRenderProgram) {
    this->m_postRenderProgram = (ShaderProgram *)0x0;
  }
  pSVar1 = this->m_preRenderProgram;
  if (pSVar1 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar1);
    operator_delete(pSVar1,0xd0);
  }
  this->m_preRenderProgram = (ShaderProgram *)0x0;
  pSVar1 = this->m_postRenderProgram;
  if (pSVar1 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar1);
    operator_delete(pSVar1,0xd0);
  }
  this->m_postRenderProgram = (ShaderProgram *)0x0;
  return;
}

Assistant:

void TextureBufferCase::deinit (void)
{
	if (m_preRenderProgram == m_postRenderProgram)
		m_postRenderProgram = DE_NULL;

	delete m_preRenderProgram;
	m_preRenderProgram = DE_NULL;

	delete m_postRenderProgram;
	m_postRenderProgram = DE_NULL;
}